

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3)

{
  bool bVar1;
  uchar local_30;
  uchar uStack_2f;
  uchar uStack_2e;
  uchar uStack_2d;
  RegSlot local_2c;
  OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  RegSlot R3_local;
  RegSlot R2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCodeAsmJs op_local;
  AsmJsByteCodeWriter *this_local;
  
  local_2c = R3;
  layout = (OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)R2;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&local_30,R0);
  if ((((bVar1) &&
       (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                          (&uStack_2f,R1), bVar1)) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                         (&uStack_2e,(uint)layout), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                        (&uStack_2d,local_2c), bVar1)) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_30,4,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg4(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3)
    {
        OpLayoutT_AsmReg4<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }